

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

bool absl::lts_20240722::container_internal::operator==(iterator *a,iterator *b)

{
  int iVar1;
  slot_type *psVar2;
  slot_type *psVar3;
  slot_type *psVar4;
  code *pcVar5;
  slot_type *psVar6;
  slot_type *psVar7;
  bool bVar8;
  int iVar9;
  FileOptions_OptimizeMode FVar10;
  reference ppVar11;
  string *psVar12;
  long lVar13;
  slot_type *psVar14;
  long lVar15;
  Options *extraout_RDX;
  ulong uVar16;
  long lVar17;
  undefined1 *puVar18;
  long lVar19;
  long lVar20;
  long *plVar21;
  long lVar22;
  ValueLimits VVar23;
  LogMessageFatal aLStack_50 [16];
  undefined1 auStack_20 [8];
  undefined8 uStack_18;
  code *pcStack_10;
  
  psVar2 = (slot_type *)a->ctrl_;
  if ((psVar2 == (slot_type *)google::protobuf::internal::TypeCardToString_abi_cxx11_ ||
       psVar2 == (slot_type *)0x0) || (-1 < (char)*(code *)psVar2)) {
    psVar3 = (slot_type *)b->ctrl_;
    if ((psVar3 != (slot_type *)google::protobuf::internal::TypeCardToString_abi_cxx11_ &&
         psVar3 != (slot_type *)0x0) && ((char)*(code *)psVar3 < '\0')) goto LAB_0017e0d2;
    if (psVar2 == (slot_type *)google::protobuf::internal::TypeCardToString_abi_cxx11_ &&
        psVar3 == (slot_type *)google::protobuf::internal::TypeCardToString_abi_cxx11_) {
LAB_0017e0bb:
      return psVar2 == psVar3;
    }
    if ((psVar2 == (slot_type *)google::protobuf::internal::TypeCardToString_abi_cxx11_) ==
        (psVar3 == (slot_type *)google::protobuf::internal::TypeCardToString_abi_cxx11_)) {
      if (psVar2 == (slot_type *)0x0 || psVar3 == (slot_type *)0x0) goto LAB_0017e0bb;
      if ((psVar3 == (slot_type *)&kSooControl) == (psVar2 == (slot_type *)&kSooControl)) {
        a = (iterator *)(a->field_1).slot_;
        psVar4 = (b->field_1).slot_;
        if (psVar2 == (slot_type *)&kSooControl) {
          if ((slot_type *)a == psVar4) goto LAB_0017e0bb;
        }
        else {
          psVar14 = psVar4;
          psVar6 = psVar3;
          psVar7 = (slot_type *)a;
          if (psVar3 < psVar2) {
            psVar14 = (slot_type *)a;
            psVar6 = psVar2;
            psVar7 = psVar4;
          }
          if ((psVar6 < psVar7) && (psVar7 <= psVar14)) goto LAB_0017e0bb;
        }
      }
      pcStack_10 = (code *)0x17e0cd;
      operator==();
      goto LAB_0017e0cd;
    }
  }
  else {
LAB_0017e0cd:
    pcStack_10 = (code *)0x17e0d2;
    operator==();
LAB_0017e0d2:
    pcStack_10 = (code *)0x17e0d7;
    operator==();
  }
  pcStack_10 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>_>
               ::iterator::operator->;
  operator==();
  pcVar5 = *(code **)a;
  if (pcVar5 == (code *)0x0) {
    uStack_18 = 0x17e105;
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>>>
    ::iterator::operator->((iterator *)a);
  }
  else if (pcVar5 != google::protobuf::internal::TypeCardToString_abi_cxx11_) {
    if (-1 < (char)*pcVar5) {
      ppVar11 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>_>
                ::iterator::operator*(a);
      return SUB81(ppVar11,0);
    }
    goto LAB_0017e10a;
  }
  uStack_18 = 0x17e10a;
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>>>
  ::iterator::operator->((iterator *)a);
LAB_0017e10a:
  uStack_18 = 0x17e10f;
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>>>
  ::iterator::operator->((iterator *)a);
  iVar9 = *(int *)((long)&(((value_type *)a)->first)._M_dataplus._M_p + 4);
  plVar21 = (long *)(long)iVar9;
  if (0 < (long)plVar21) {
    lVar19 = *(long *)((long)a + 0x38);
    if (iVar9 != 1) {
      lVar22 = (long)plVar21 + -1;
      lVar17 = lVar19;
      lVar15 = lVar19;
      lVar20 = lVar19;
      do {
        lVar13 = lVar20 + 0x30;
        lVar19 = lVar13;
        if (*(int *)(lVar15 + 4) <= *(int *)(lVar20 + 0x34)) {
          lVar19 = lVar15;
        }
        lVar15 = lVar13;
        if (*(int *)(lVar20 + 0x34) <= *(int *)(lVar17 + 4)) {
          lVar15 = lVar17;
        }
        lVar22 = lVar22 + -1;
        lVar17 = lVar15;
        lVar15 = lVar19;
        lVar20 = lVar13;
      } while (lVar22 != 0);
    }
    return SUB81(lVar19,0);
  }
  puVar18 = auStack_20;
  google::protobuf::compiler::cpp::EnumGenerator::ValueLimits::FromEnum();
  *plVar21 = (long)puVar18;
  google::protobuf::compiler::cpp::Options::Options((Options *)(plVar21 + 1),extraout_RDX);
  lVar19 = (long)*(int *)(puVar18 + 4);
  if (0 < lVar19) {
    iVar9 = *(int *)(*(long *)(puVar18 + 0x38) + 4);
    lVar20 = 0;
    do {
      iVar1 = *(int *)(*(long *)(puVar18 + 0x38) + 4 + lVar20);
      if (iVar9 < iVar1) {
        iVar9 = iVar1;
      }
      lVar20 = lVar20 + 0x30;
    } while (lVar19 * 0x30 != lVar20);
    *(bool *)(plVar21 + 0x1b) = iVar9 != 0x7fffffff;
    FVar10 = google::protobuf::compiler::cpp::GetOptimizeFor
                       (*(FileDescriptor **)(*plVar21 + 0x10),(Options *)(plVar21 + 1),(bool *)0x0);
    *(bool *)((long)plVar21 + 0xda) = FVar10 != FileOptions_OptimizeMode_LITE_RUNTIME;
    VVar23 = google::protobuf::compiler::cpp::EnumGenerator::ValueLimits::FromEnum
                       ((EnumDescriptor *)*plVar21);
    *(ValueLimits *)(plVar21 + 0x1c) = VVar23;
    if (*(char *)((long)plVar21 + 0xda) == '\x01') {
      uVar16 = (long)*(int *)(VVar23.max + 4) - (long)*(int *)(VVar23.min + 4);
      bVar8 = uVar16 < (ulong)((long)*(int *)(*plVar21 + 4) * 2) || uVar16 < 0x10;
    }
    else {
      bVar8 = false;
    }
    *(bool *)((long)plVar21 + 0xd9) = bVar8;
    return bVar8;
  }
  psVar12 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                      (0,lVar19,"index < value_count()");
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (aLStack_50,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.h"
             ,0xa27,*(undefined8 *)(psVar12 + 8),*(undefined8 *)psVar12);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_50);
}

Assistant:

bool operator==(const iterator& a, const iterator& b) {
      AssertIsValidForComparison(a.ctrl_, a.generation(), a.generation_ptr());
      AssertIsValidForComparison(b.ctrl_, b.generation(), b.generation_ptr());
      AssertSameContainer(a.ctrl_, b.ctrl_, a.slot_, b.slot_,
                          a.generation_ptr(), b.generation_ptr());
      return a.ctrl_ == b.ctrl_;
    }